

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O2

void __thiscall duckdb::BaseUnionData::~BaseUnionData(BaseUnionData *this)

{
  ~BaseUnionData(this);
  operator_delete(this);
  return;
}

Assistant:

DUCKDB_API virtual ~BaseUnionData() = default;